

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void Js::InterpreterStackFrame::TraceOpCode(InterpreterStackFrame *that,OpCode op)

{
  bool bVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  char16 *pcVar4;
  OpCode op_local;
  InterpreterStackFrame *that_local;
  
  *(int *)(*(long *)(that + 0x78) + 0xb38 + (long)(int)(uint)op * 4) =
       *(int *)(*(long *)(that + 0x78) + 0xb38 + (long)(int)(uint)op * 4) + 1;
  uVar2 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  LVar3 = FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(that + 0x88));
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InterpreterPhase,uVar2,LVar3);
  if (bVar1) {
    uVar2 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
    LVar3 = FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(that + 0x88));
    pcVar4 = OpCodeUtil::GetOpCodeName(op);
    Output::Print(L"%d.%d:Executing %s at offset 0x%X\n",(ulong)uVar2,(ulong)LVar3,pcVar4,
                  *(undefined8 *)(that + 0x108));
  }
  return;
}

Assistant:

void InterpreterStackFrame::TraceOpCode(InterpreterStackFrame* that, Js::OpCode op)
    {
#if DBG_DUMP
        that->scriptContext->byteCodeHistogram[(int)op]++;
        if (PHASE_TRACE(Js::InterpreterPhase, that->m_functionBody))
        {
            Output::Print(_u("%d.%d:Executing %s at offset 0x%X\n"), that->m_functionBody->GetSourceContextId(), that->m_functionBody->GetLocalFunctionId(), Js::OpCodeUtil::GetOpCodeName(op), that->DEBUG_currentByteOffset);
        }
#endif
    }